

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# citylots_std.cpp
# Opt level: O2

void * parseObject(SymbolContext<char> *ctx)

{
  JSONValue *this;
  bool bVar1;
  JSONValue *pJVar2;
  JSONString *pJVar3;
  allocator local_39;
  string local_38;
  
  if (ctx->num_values != 0) {
    this = (JSONValue *)*ctx->values;
    if (this->type != Object) {
      return this;
    }
    std::__cxx11::string::string((string *)&local_38,"type",&local_39);
    bVar1 = JSONValue::has_item(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (!bVar1) {
      return this;
    }
    std::__cxx11::string::string((string *)&local_38,"type",&local_39);
    pJVar2 = JSONValue::operator[](this,&local_38);
    pJVar3 = JSONValue::str_abi_cxx11_(pJVar2);
    bVar1 = std::operator==(pJVar3,"Feature");
    std::__cxx11::string::~string((string *)&local_38);
    if (!bVar1) {
      return this;
    }
    std::__cxx11::string::string((string *)&local_38,"properties",&local_39);
    bVar1 = JSONValue::has_item(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (!bVar1) {
      return this;
    }
    std::__cxx11::string::string((string *)&local_38,"properties",&local_39);
    pJVar2 = JSONValue::operator[](this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::string((string *)&local_38,"STREET",&local_39);
    bVar1 = JSONValue::has_item(pJVar2,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (!bVar1) {
      return this;
    }
    std::__cxx11::string::string((string *)&local_38,"STREET",&local_39);
    pJVar2 = JSONValue::operator[](pJVar2,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (pJVar2->type != String) {
      return this;
    }
    pJVar3 = JSONValue::str_abi_cxx11_(pJVar2);
    bVar1 = std::operator!=(pJVar3,"JEFFERSON");
    if (!bVar1) {
      return this;
    }
    JSONValue::~JSONValue(this);
    operator_delete(this);
  }
  return (void *)0x0;
}

Assistant:

void *parseObject(const SymbolContext<char>& ctx)
{
    if (ctx.count() == 0) return nullptr;

    JSONValue *v = ctx.value<JSONValue>(1);

    if (v->is_object() && v->has_item("type"))
    {
        if (v->operator[]("type").str() == "Feature")
        {
            if (v->has_item("properties"))
            {
                const JSONValue& properties = v->operator[]("properties");

                if (properties.has_item("STREET"))
                {
                    const JSONValue& street = properties.operator[]("STREET");
                    if (street.is_str())
                    {
                        if (street.str() != "JEFFERSON")
                        {
                            delete v;
                            return nullptr;
                        }
                        else
                        {
                            // count++;
                        }
                    }
                    else
                    {
                        // count++;
                    }
                }
            }
        }
    }
    return v;
}